

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O2

void RDL_deleteCycleFams(RDL_cfURF *rc)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < rc->nofFams; uVar1 = uVar1 + 1) {
    free(rc->fams[uVar1]->prototype);
    free(rc->fams[uVar1]);
  }
  free(rc->fams);
  free(rc);
  return;
}

Assistant:

void RDL_deleteCycleFams(RDL_cfURF *rc)
{
  unsigned i;
  for(i=0; i<rc->nofFams; ++i)
  {
    free(rc->fams[i]->prototype);
    free(rc->fams[i]);
  }
  free(rc->fams);
  free(rc);
}